

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu.cpp
# Opt level: O2

void __thiscall IMMU::IMMU(IMMU *this,CPU *cpu_pointer)

{
  uint uVar1;
  int iVar2;
  IMMU *this_00;
  
  this_00 = this;
  MMU::MMU(&this->super_MMU);
  (this->super_MMU).cpu = cpu_pointer;
  (this->super_MMU).enabled = 0;
  (this->super_MMU).nways = 1;
  (this->super_MMU).nsets = 1;
  (this->super_MMU).pagesize = 0x2000;
  (this->super_MMU).entrysize = 1;
  (this->super_MMU).ustates = 2;
  (this->super_MMU).missdelay = 1;
  (this->super_MMU).hitdelay = 1;
  *(byte *)(cpu_pointer->sprs + 1) = (byte)cpu_pointer->sprs[1] & 0xef;
  iVar2 = MMU::log2_int(&this_00->super_MMU,(this->super_MMU).nsets);
  uVar1 = cpu_pointer->sprs[4];
  cpu_pointer->sprs[4] = iVar2 << 2 | uVar1 & 0xffffffe3;
  cpu_pointer->sprs[4] = iVar2 << 2 | uVar1 & 0xffffffe0 | (this->super_MMU).nways - 1U;
  return;
}

Assistant:

IMMU::IMMU(CPU *cpu_pointer)
{
    int set_bits;
    int way_bits;

    cpu = cpu_pointer;
    enabled = 0;
    nsets = 1;
    nways = 1;
    pagesize = 8192;
    entrysize = 1; /* Not currently used */
    ustates = 2;
    hitdelay = 1;
    missdelay = 1;

    if (enabled)
    {
        cpu->sprs[SPR_UPR] |= SPR_UPR_IMP;
    }
    else
    {
        cpu->sprs[SPR_UPR] &= ~SPR_UPR_IMP;
    }

    set_bits = log2_int(nsets);
    cpu->sprs[SPR_IMMUCFGR] &= ~SPR_IMMUCFGR_NTS;
    cpu->sprs[SPR_IMMUCFGR] |= set_bits << SPR_IMMUCFGR_NTS_OFF;

    way_bits = nways - 1;
    cpu->sprs[SPR_IMMUCFGR] &= ~SPR_IMMUCFGR_NTW;
    cpu->sprs[SPR_IMMUCFGR] |= way_bits << SPR_IMMUCFGR_NTW_OFF;
}